

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O1

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  _Map_pointer ppuVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  _Elt_pointer puVar12;
  
  ppuVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar4 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar5 = 0;
  puVar8 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar2 - (long)ppuVar4) >> 3) - 1) +
                   (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar3));
  if (puVar8 != (_Elt_pointer)0x0) {
    uVar1 = *(uint *)(this + 0x40c);
    uVar9 = 0;
    uVar5 = 0;
    do {
      if (puVar8 + ~uVar9 == (_Elt_pointer)0x0) {
        uVar6 = 1;
      }
      else {
        uVar7 = 1;
        uVar6 = 1;
        do {
          uVar6 = uVar6 * 0x25 & uVar1;
          puVar12 = (_Elt_pointer)(ulong)uVar7;
          uVar7 = uVar7 + 1;
        } while (puVar12 < puVar8 + ~uVar9);
      }
      puVar12 = puVar3 + (uVar9 - (long)(c->
                                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl.super__Deque_impl_data._M_start._M_first);
      if (puVar12 < (_Elt_pointer)0x200) {
        pbVar11 = puVar3 + uVar9;
      }
      else {
        uVar10 = ((ulong)puVar12 >> 9) + 0xff80000000000000;
        if (0 < (long)puVar12) {
          uVar10 = (ulong)puVar12 >> 9;
        }
        pbVar11 = ppuVar4[uVar10] + (long)(puVar12 + uVar10 * -0x200);
      }
      uVar5 = uVar5 + (uVar6 * *(int *)(this + (ulong)*pbVar11 * 4 + 0xc) & uVar1) & uVar1;
      uVar9 = uVar9 + 1;
    } while ((_Elt_pointer)(uVar9 & 0xffffffff) < puVar8);
  }
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }